

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

string * QPDFJob::job_json_schema_v1_abi_cxx11_(void)

{
  int in_EDX;
  string *in_RDI;
  
  job_json_schema_abi_cxx11_(in_RDI,(QPDFJob *)0x1,in_EDX);
  return in_RDI;
}

Assistant:

std::string
QPDFJob::job_json_schema_v1()
{
    return job_json_schema(1);
}